

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_add_tet_without_faceid(REF_CAVITY ref_cavity,REF_INT tet,REF_INT faceid)

{
  int iVar1;
  REF_GRID pRVar2;
  REF_CELL pRVar3;
  REF_NODE pRVar4;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_INT *pRVar7;
  REF_MPI pRVar8;
  REF_INT *pRVar9;
  long lVar10;
  uint uVar11;
  undefined8 uVar12;
  char *pcVar13;
  long lVar14;
  uint local_70;
  REF_INT already_have_it;
  REF_INT tri_index;
  REF_CELL local_60;
  long local_58;
  REF_NODE local_50;
  long local_48;
  REF_INT face_nodes [3];
  
  if (-1 < tet) {
    pRVar2 = ref_cavity->ref_grid;
    pRVar3 = pRVar2->cell[8];
    if ((tet < pRVar3->max) &&
       (local_48 = (long)tet, pRVar3->c2n[pRVar3->size_per * local_48] != -1)) {
      pRVar4 = pRVar2->node;
      pRVar5 = pRVar2->cell[3];
      uVar11 = ref_list_contains(ref_cavity->tet_list,tet,&already_have_it);
      if (uVar11 == 0) {
        if (already_have_it != 0) {
          return 0;
        }
        local_60 = pRVar5;
        local_50 = pRVar4;
        uVar11 = ref_list_push(ref_cavity->tet_list,tet);
        lVar10 = local_48;
        if (uVar11 == 0) {
          local_58 = 0;
          local_70 = 0;
          do {
            if (pRVar3->face_per <= local_58) {
              return 0;
            }
            pRVar6 = pRVar3->c2n;
            pRVar7 = local_50->part;
            pRVar8 = local_50->ref_mpi;
            pRVar9 = pRVar3->f2n;
            lVar14 = 0;
            while (lVar14 != 3) {
              iVar1 = pRVar6[pRVar3->size_per * lVar10 +
                             (long)pRVar9[(ulong)((uint)local_58 & 0x3fffffff) * 4 + lVar14]];
              face_nodes[lVar14] = iVar1;
              lVar14 = lVar14 + 1;
              if (pRVar8->id != pRVar7[iVar1]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            uVar11 = ref_cell_with(local_60,face_nodes,&tri_index);
            if ((uVar11 != 0) && (uVar11 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x264,"ref_cavity_add_tet_without_faceid",(ulong)uVar11,
                     "search for boundary tri");
              local_70 = uVar11;
            }
            if ((uVar11 != 5) && (uVar11 != 0)) {
              return local_70;
            }
            if (((long)tri_index == -1) ||
               (local_60->c2n[(long)local_60->size_per * (long)tri_index + 3] != faceid)) {
              uVar11 = ref_cavity_insert_face(ref_cavity,face_nodes);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x26a,"ref_cavity_add_tet_without_faceid",(ulong)uVar11,"tet side");
                return uVar11;
              }
              if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
                return 0;
              }
            }
            local_58 = local_58 + 1;
          } while( true );
        }
        pcVar13 = "save tet";
        uVar12 = 600;
      }
      else {
        pcVar13 = "have tet?";
        uVar12 = 0x255;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar12,"ref_cavity_add_tet_without_faceid",(ulong)uVar11,pcVar13);
      return uVar11;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x252,
         "ref_cavity_add_tet_without_faceid","invalid tet");
  return 1;
}

Assistant:

static REF_FCN REF_STATUS ref_cavity_add_tet_without_faceid(
    REF_CAVITY ref_cavity, REF_INT tet, REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tet_cell = ref_grid_tet(ref_grid);
  REF_CELL tri_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell_face, node, tri_index;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(tet_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(tet_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(tet_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }

    RXS(ref_cell_with(tri_cell, face_nodes, &tri_index), REF_NOT_FOUND,
        "search for boundary tri");
    if (REF_EMPTY != tri_index &&
        ref_cell_c2n(tri_cell, 3, tri_index) == faceid) {
      continue;
    }

    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}